

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode Curl_add_buffer(Curl_send_buffer **inp,void *inptr,size_t size)

{
  Curl_send_buffer *pCVar1;
  CURLcode CVar2;
  char *ptr;
  ulong uVar3;
  size_t size_00;
  
  pCVar1 = *inp;
  uVar3 = pCVar1->size_used;
  if (CARRY8(size,uVar3)) {
    (*Curl_cfree)(pCVar1->buffer);
    pCVar1->buffer = (char *)0x0;
    (*Curl_cfree)(pCVar1);
    *inp = (Curl_send_buffer *)0x0;
LAB_00481e56:
    CVar2 = CURLE_OUT_OF_MEMORY;
  }
  else {
    ptr = pCVar1->buffer;
    if ((ptr == (char *)0x0) || (pCVar1->size_max - 1 < size + uVar3)) {
      size_00 = 0xffffffffffffffff;
      if ((-1 < (long)(uVar3 | size)) && (!CARRY8(uVar3 * 2,size * 2))) {
        size_00 = (size + uVar3) * 2;
      }
      if (ptr == (char *)0x0) {
        ptr = (char *)(*Curl_cmalloc)(size_00);
      }
      else {
        ptr = (char *)Curl_saferealloc(ptr,size_00);
      }
      if (ptr == (char *)0x0) {
        (*Curl_cfree)(pCVar1);
        *inp = (Curl_send_buffer *)0x0;
        goto LAB_00481e56;
      }
      pCVar1->buffer = ptr;
      pCVar1->size_max = size_00;
      uVar3 = pCVar1->size_used;
    }
    memcpy(ptr + uVar3,inptr,size);
    pCVar1->size_used = pCVar1->size_used + size;
    CVar2 = CURLE_OK;
  }
  return CVar2;
}

Assistant:

CURLcode Curl_add_buffer(Curl_send_buffer **inp, const void *inptr,
                         size_t size)
{
  char *new_rb;
  Curl_send_buffer *in = *inp;

  if(~size < in->size_used) {
    /* If resulting used size of send buffer would wrap size_t, cleanup
       the whole buffer and return error. Otherwise the required buffer
       size will fit into a single allocatable memory chunk */
    Curl_safefree(in->buffer);
    free(in);
    *inp = NULL;
    return CURLE_OUT_OF_MEMORY;
  }

  if(!in->buffer ||
     ((in->size_used + size) > (in->size_max - 1))) {
    /* If current buffer size isn't enough to hold the result, use a
       buffer size that doubles the required size. If this new size
       would wrap size_t, then just use the largest possible one */
    size_t new_size;

    if((size > (size_t)-1 / 2) || (in->size_used > (size_t)-1 / 2) ||
       (~(size * 2) < (in->size_used * 2)))
      new_size = (size_t)-1;
    else
      new_size = (in->size_used + size) * 2;

    if(in->buffer)
      /* we have a buffer, enlarge the existing one */
      new_rb = Curl_saferealloc(in->buffer, new_size);
    else
      /* create a new buffer */
      new_rb = malloc(new_size);

    if(!new_rb) {
      /* If we failed, we cleanup the whole buffer and return error */
      free(in);
      *inp = NULL;
      return CURLE_OUT_OF_MEMORY;
    }

    in->buffer = new_rb;
    in->size_max = new_size;
  }
  memcpy(&in->buffer[in->size_used], inptr, size);

  in->size_used += size;

  return CURLE_OK;
}